

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

void tcmalloc::ThreadCache::GlobalInit(void)

{
  CentralFreelist *this;
  long lVar1;
  
  if (global_inited == '\0') {
    this = (CentralFreelist *)(central_freelists + 0x4f0);
    for (lVar1 = -0x55; lVar1 != 0; lVar1 = lVar1 + 1) {
      CentralFreelist::Init(this,(int)lVar1 + 0x56);
      this = this + 1;
    }
    pthread_key_create(&spec_key,DestroyThreadCache);
    cache_list._4144_8_ = cache_list;
    cache_list._4152_8_ = cache_list;
    next_cache_steal = cache_list;
    global_inited = 1;
    return;
  }
  __assert_fail("!global_inited",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                ,0xdf,"static void tcmalloc::ThreadCache::GlobalInit()");
}

Assistant:

static void GlobalInit() {
        assert(!global_inited);
        for (int cl = 1; cl < kMaxClass; ++cl) {
            central_freelists[cl].Init(cl);
        }
        pthread_key_create(&spec_key, DestroyThreadCache);
        CacheListInit(&cache_list);
        next_cache_steal = &cache_list;
        global_inited = true;
    }